

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_outbound_item.c
# Opt level: O3

void nghttp2_outbound_queue_pop(nghttp2_outbound_queue *q)

{
  nghttp2_outbound_item *pnVar1;
  nghttp2_outbound_item *pnVar2;
  
  pnVar1 = q->head;
  if (pnVar1 != (nghttp2_outbound_item *)0x0) {
    pnVar2 = pnVar1->qnext;
    q->head = pnVar2;
    pnVar1->qnext = (nghttp2_outbound_item *)0x0;
    if (pnVar2 == (nghttp2_outbound_item *)0x0) {
      q->tail = (nghttp2_outbound_item *)0x0;
    }
    q->n = q->n - 1;
  }
  return;
}

Assistant:

void nghttp2_outbound_queue_pop(nghttp2_outbound_queue *q) {
  nghttp2_outbound_item *item;
  if (!q->head) {
    return;
  }
  item = q->head;
  q->head = q->head->qnext;
  item->qnext = NULL;
  if (!q->head) {
    q->tail = NULL;
  }
  --q->n;
}